

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::AddCalleeSourceInfoToList(ScriptContext *this,Utf8SourceInfo *sourceInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar5;
  TrackAllocData local_50;
  Recycler *local_28;
  Recycler *recycler;
  RecyclerWeakReference<Js::Utf8SourceInfo> *sourceInfoWeakRef;
  Utf8SourceInfo *sourceInfo_local;
  ScriptContext *this_local;
  
  sourceInfoWeakRef = (RecyclerWeakReference<Js::Utf8SourceInfo> *)sourceInfo;
  sourceInfo_local = (Utf8SourceInfo *)this;
  if (sourceInfo == (Utf8SourceInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x19e1,"(sourceInfo)","sourceInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  recycler = (Recycler *)0x0;
  pRVar4 = GetRecycler(this);
  Memory::Recycler::FindOrCreateWeakReferenceHandle<Js::Utf8SourceInfo>
            (pRVar4,(Utf8SourceInfo *)sourceInfoWeakRef,
             (RecyclerWeakReference<Js::Utf8SourceInfo> **)&recycler);
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x19e5,"(sourceInfoWeakRef)","sourceInfoWeakRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pLVar5 = Memory::RecyclerRootPtr::operator_cast_to_List_
                     ((RecyclerRootPtr *)&this->calleeUtf8SourceInfoList);
  if (pLVar5 == (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                 *)0x0) {
    pRVar4 = GetRecycler(this);
    local_28 = pRVar4;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,
               (type_info *)
               &JsUtil::
                List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x19ea);
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_50);
    pLVar5 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,pRVar4,0x43c4b0);
    JsUtil::
    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
    ::List(pLVar5,local_28,4);
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
    ::Root(&this->calleeUtf8SourceInfoList,pLVar5,local_28);
  }
  pLVar5 = Memory::
           RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
           ::operator->(&this->calleeUtf8SourceInfoList);
  bVar2 = JsUtil::
          ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
          ::Contains(&pLVar5->
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                     ,(RecyclerWeakReference<Js::Utf8SourceInfo> **)&recycler);
  if (!bVar2) {
    pLVar5 = Memory::
             RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->calleeUtf8SourceInfoList);
    JsUtil::
    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
    ::Add(pLVar5,(RecyclerWeakReference<Js::Utf8SourceInfo> **)&recycler);
  }
  return;
}

Assistant:

void ScriptContext::AddCalleeSourceInfoToList(Utf8SourceInfo* sourceInfo)
    {
        Assert(sourceInfo);

        RecyclerWeakReference<Js::Utf8SourceInfo>* sourceInfoWeakRef = nullptr;
        this->GetRecycler()->FindOrCreateWeakReferenceHandle(sourceInfo, &sourceInfoWeakRef);
        Assert(sourceInfoWeakRef);

        if (!calleeUtf8SourceInfoList)
        {
            Recycler *recycler = this->GetRecycler();
            calleeUtf8SourceInfoList.Root(RecyclerNew(recycler, CalleeSourceList, recycler), recycler);
        }

        if (!calleeUtf8SourceInfoList->Contains(sourceInfoWeakRef))
        {
            calleeUtf8SourceInfoList->Add(sourceInfoWeakRef);
        }
    }